

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

char * buffer_merge(Buffer **buffers,size_t n,size_t *_len)

{
  Buffer *pBVar1;
  BufferBlock *pBVar2;
  Buffer *local_78;
  BufferBlock *next;
  BufferBlock *item;
  Buffer *buffer_1;
  char *ptr;
  char *retval;
  Buffer *buffer;
  size_t i;
  size_t len;
  Buffer *first;
  size_t *_len_local;
  size_t n_local;
  Buffer **buffers_local;
  
  len = 0;
  i = 0;
  for (buffer = (Buffer *)0x0; buffer < n; buffer = (Buffer *)((long)&buffer->total_bytes + 1)) {
    pBVar1 = buffers[(long)buffer];
    if (pBVar1 != (Buffer *)0x0) {
      if (len == 0) {
        len = (size_t)pBVar1;
      }
      i = pBVar1->total_bytes + i;
    }
  }
  if (len == 0) {
    local_78 = (Buffer *)0x0;
  }
  else {
    local_78 = (Buffer *)(**(code **)(len + 0x20))((int)i + 1,*(undefined8 *)(len + 0x30));
  }
  if (local_78 == (Buffer *)0x0) {
    *_len = 0;
    buffers_local = (Buffer **)0x0;
  }
  else {
    *_len = i;
    buffer_1 = local_78;
    for (buffer = (Buffer *)0x0; buffer < n; buffer = (Buffer *)((long)&buffer->total_bytes + 1)) {
      pBVar1 = buffers[(long)buffer];
      if (pBVar1 != (Buffer *)0x0) {
        next = pBVar1->head;
        while (next != (BufferBlock *)0x0) {
          pBVar2 = next->next;
          memcpy(buffer_1,next->data,next->bytes);
          buffer_1 = (Buffer *)((long)&buffer_1->total_bytes + next->bytes);
          (*pBVar1->f)(next,pBVar1->d);
          next = pBVar2;
        }
        pBVar1->tail = (BufferBlock *)0x0;
        pBVar1->head = (BufferBlock *)0x0;
        pBVar1->total_bytes = 0;
      }
    }
    *(undefined1 *)&buffer_1->total_bytes = 0;
    if (buffer_1 != (Buffer *)((long)&local_78->total_bytes + i)) {
      __assert_fail("ptr == (retval + len)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x399,"char *buffer_merge(Buffer **, const size_t, size_t *)");
    }
    buffers_local = (Buffer **)local_78;
  }
  return (char *)buffers_local;
}

Assistant:

char *buffer_merge(Buffer **buffers, const size_t n, size_t *_len)
{
    Buffer *first = NULL;
    size_t len = 0;
    size_t i;
    for (i = 0; i < n; i++)
    {
        Buffer *buffer = buffers[i];
        if (buffer == NULL)
            continue;
        if (first == NULL)
            first = buffer;
        len += buffer->total_bytes;
    } // for

    char *retval = (char *) (first ? first->m(len + 1, first->d) : NULL);
    if (retval == NULL)
    {
        *_len = 0;
        return NULL;
    } // if

    *_len = len;
    char *ptr = retval;
    for (i = 0; i < n; i++)
    {
        Buffer *buffer = buffers[i];
        if (buffer == NULL)
            continue;
        BufferBlock *item = buffer->head;
        while (item != NULL)
        {
            BufferBlock *next = item->next;
            memcpy(ptr, item->data, item->bytes);
            ptr += item->bytes;
            buffer->f(item, buffer->d);
            item = next;
        } // while

        buffer->head = buffer->tail = NULL;
        buffer->total_bytes = 0;
    } // for
    *ptr = '\0';

    assert(ptr == (retval + len));

    return retval;
}